

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

FileOpenFlags __thiscall
duckdb::SingleFileBlockManager::GetFileFlags(SingleFileBlockManager *this,bool create_new)

{
  unkbyte10 Var1;
  undefined1 auVar2 [16];
  ulong uVar3;
  FileOpenFlags FVar4;
  FileOpenFlags FVar5;
  FileOpenFlags b;
  FileOpenFlags local_20;
  
  if ((this->options).read_only == true) {
    b.lock = NO_LOCK;
    b.compression = UNCOMPRESSED;
    b._10_6_ = 0;
    b.flags = 0x80;
    FVar4 = FileOpenFlags::operator|((FileOpenFlags *)FileFlags::FILE_FLAGS_READ,b);
    local_20.flags = FVar4.flags;
    local_20._8_2_ = FVar4._8_2_;
    FVar4 = FileOpenFlags::operator|(&local_20,(FileOpenFlags)(ZEXT816(0x101) << 0x40));
    Var1 = FVar4._0_10_;
  }
  else {
    FVar4.lock = NO_LOCK;
    FVar4.compression = UNCOMPRESSED;
    FVar4._10_6_ = 0;
    FVar4.flags = 1;
    FVar4 = FileOpenFlags::operator|((FileOpenFlags *)FileFlags::FILE_FLAGS_WRITE,FVar4);
    local_20.flags = FVar4.flags;
    local_20._8_2_ = FVar4._8_2_;
    FVar4 = FileOpenFlags::operator|(&local_20,(FileOpenFlags)(ZEXT816(0x102) << 0x40));
    auVar2._8_8_ = FVar4._8_8_;
    auVar2._0_8_ = FVar4.flags | 8;
    Var1 = auVar2._0_10_;
    if (!create_new) {
      Var1 = FVar4._0_10_;
    }
  }
  uVar3 = (ulong)Var1 | 4;
  if ((this->options).use_direct_io == false) {
    uVar3 = (ulong)Var1;
  }
  FVar5._8_2_ = (undefined2)((unkuint10)Var1 >> 0x40);
  FVar5.flags = uVar3 | 0x100;
  FVar5._10_6_ = 0;
  return FVar5;
}

Assistant:

FileOpenFlags SingleFileBlockManager::GetFileFlags(bool create_new) const {
	FileOpenFlags result;
	if (options.read_only) {
		D_ASSERT(!create_new);
		result = FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS | FileLockType::READ_LOCK;
	} else {
		result = FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_READ | FileLockType::WRITE_LOCK;
		if (create_new) {
			result |= FileFlags::FILE_FLAGS_FILE_CREATE;
		}
	}
	if (options.use_direct_io) {
		result |= FileFlags::FILE_FLAGS_DIRECT_IO;
	}
	// database files can be read from in parallel
	result |= FileFlags::FILE_FLAGS_PARALLEL_ACCESS;
	return result;
}